

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MacMessage.c
# Opt level: O1

_Bool COSE_Mac_SetContent(HCOSE_MAC cose,byte *rgbContent,size_t cbContent,cose_errback *perr)

{
  _Bool _Var1;
  cose_error cVar2;
  cn_cbor_errback in_RAX;
  cn_cbor *cb_value;
  COSE_MacMessage *p;
  cn_cbor_errback cbor_error;
  cn_cbor_errback local_28;
  
  local_28 = in_RAX;
  _Var1 = _COSE_IsInList(MacRoot,(COSE *)cose);
  if (_Var1) {
    cb_value = cn_cbor_data_create(rgbContent,(int)cbContent,&local_28);
    if (cb_value == (cn_cbor *)0x0) {
      cb_value = (cn_cbor *)0x0;
    }
    else {
      _Var1 = _COSE_array_replace((COSE *)cose,cb_value,2,&local_28);
      if (_Var1) {
        return true;
      }
    }
    if (perr == (cose_errback *)0x0) goto LAB_0019a77e;
    cVar2 = _MapFromCBOR(local_28);
  }
  else {
    cVar2 = COSE_ERR_INVALID_PARAMETER;
    cb_value = (cn_cbor *)0x0;
    if (perr == (cose_errback *)0x0) goto LAB_0019a77e;
  }
  perr->err = cVar2;
LAB_0019a77e:
  if (cb_value != (cn_cbor *)0x0) {
    cn_cbor_free(cb_value);
  }
  return false;
}

Assistant:

bool COSE_Mac_SetContent(HCOSE_MAC cose, const byte * rgbContent, size_t cbContent, cose_errback * perr)
{
	COSE_MacMessage * p = (COSE_MacMessage *)cose;
#ifdef USE_CBOR_CONTEXT        
	cn_cbor_context * context = &p->m_message.m_allocContext;
#endif
	cn_cbor * ptmp = NULL;
	cn_cbor_errback cbor_error;

	CHECK_CONDITION(IsValidMacHandle(cose), COSE_ERR_INVALID_PARAMETER);

	ptmp = cn_cbor_data_create(rgbContent, (int) cbContent, CBOR_CONTEXT_PARAM_COMMA &cbor_error);
	CHECK_CONDITION_CBOR(ptmp != NULL, cbor_error);

	CHECK_CONDITION_CBOR(_COSE_array_replace(&p->m_message, ptmp, INDEX_BODY, CBOR_CONTEXT_PARAM_COMMA &cbor_error),  cbor_error);
	ptmp = NULL;

	return true;

errorReturn:
	if (ptmp != NULL) CN_CBOR_FREE(ptmp, context);
	return false;
}